

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O2

void beltBin2StrAdd(u32 mod,u16 *str,size_t count,octet *bin,size_t b)

{
  word wVar1;
  u16 *uu;
  size_t sVar2;
  bool bVar3;
  
  if (mod == 0x10000) {
    u16From((u16 *)bin,bin,b * 8);
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      str[count] = str[count] + *(short *)(bin + count * 2);
    }
  }
  else {
    u64From((u64 *)bin,bin,b * 8);
    for (sVar2 = 0; count != sVar2; sVar2 = sVar2 + 1) {
      wVar1 = zzModW((word *)bin,b & 0x1fffffffffffffff,(ulong)mod);
      str[sVar2] = (u16)(((int)wVar1 + (uint)str[sVar2]) % mod);
      zzDivW((word *)bin,(word *)bin,b & 0x1fffffffffffffff,(ulong)mod);
    }
  }
  return;
}

Assistant:

static void beltBin2StrAdd(u32 mod, u16 str[], size_t count, 
	octet bin[], size_t b)
{
	register u32 t;
	word* a;
	size_t m;
	// особый случай: mod может не уложиться в word
	if (mod == 65536)
	{
		u16* uu = (u16*)bin;
		u16From(uu, bin, 8 * b);
		while (count--)
			str[count] += uu[count];
		return;
	}
	// настроить память
	m = W_OF_O(8 * b);
	a = (word*)bin;
	wwFrom(a, bin, 8 * b);
	// конвертировать и сложить
	ASSERT(2 <= mod && mod < 65536);
	while (count--)
	{
		t = (u32)zzModW(a, m, mod);
		t += str[0], t %= mod;
		str[0] = (u16)t, ++str;
		zzDivW(a, a, m, mod);
	}
	t = 0;
}